

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

int det_4d_filter(double *p0,double *p1,double *p2,double *p3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_c8;
  double upper_bound_1;
  double lower_bound_1;
  double max4;
  double max3;
  double max2;
  double max1;
  double eps;
  int int_tmp_result;
  double Delta;
  double m234;
  double m134;
  double m124;
  double m123;
  double m34;
  double m24;
  double m23;
  double m14;
  double m13;
  double m12;
  double *p3_local;
  double *p2_local;
  double *p1_local;
  double *p0_local;
  
  dVar1 = *p1 * p0[1] + -(*p0 * p1[1]);
  dVar2 = *p2 * p0[1] + -(*p0 * p2[1]);
  dVar3 = *p3 * p0[1] + -(*p0 * p3[1]);
  dVar4 = *p2 * p1[1] + -(*p1 * p2[1]);
  dVar5 = *p3 * p1[1] + -(*p1 * p3[1]);
  dVar6 = *p3 * p2[1] + -(*p2 * p3[1]);
  dVar1 = -(dVar1 * p2[2] + dVar4 * p0[2] + -(dVar2 * p1[2])) * p3[3] +
          (dVar1 * p3[2] + dVar5 * p0[2] + -(dVar3 * p1[2])) * p2[3] +
          (dVar4 * p3[2] + dVar6 * p1[2] + -(dVar5 * p2[2])) * p0[3] +
          -((dVar2 * p3[2] + dVar6 * p0[2] + -(dVar3 * p2[2])) * p1[3]);
  max2 = ABS(*p0);
  if (max2 < ABS(*p1)) {
    max2 = ABS(*p1);
  }
  if (max2 < ABS(*p2)) {
    max2 = ABS(*p2);
  }
  if (max2 < ABS(*p3)) {
    max2 = ABS(*p3);
  }
  max3 = ABS(p0[1]);
  if (max3 < ABS(p1[1])) {
    max3 = ABS(p1[1]);
  }
  if (max3 < ABS(p2[1])) {
    max3 = ABS(p2[1]);
  }
  if (max3 < ABS(p3[1])) {
    max3 = ABS(p3[1]);
  }
  max4 = ABS(p0[2]);
  if (max4 < ABS(p1[2])) {
    max4 = ABS(p1[2]);
  }
  if (max4 < ABS(p2[2])) {
    max4 = ABS(p2[2]);
  }
  if (max4 < ABS(p3[2])) {
    max4 = ABS(p3[2]);
  }
  lower_bound_1 = ABS(p0[3]);
  if (lower_bound_1 < ABS(p1[3])) {
    lower_bound_1 = ABS(p1[3]);
  }
  if (lower_bound_1 < ABS(p2[3])) {
    lower_bound_1 = ABS(p2[3]);
  }
  if (lower_bound_1 < ABS(p3[3])) {
    lower_bound_1 = ABS(p3[3]);
  }
  upper_bound_1 = max2;
  local_c8 = max2;
  if (max2 <= max3) {
    if (max2 < max3) {
      local_c8 = max3;
    }
  }
  else {
    upper_bound_1 = max3;
  }
  if (upper_bound_1 <= max4) {
    if (local_c8 < max4) {
      local_c8 = max4;
    }
  }
  else {
    upper_bound_1 = max4;
  }
  if (upper_bound_1 <= lower_bound_1) {
    if (local_c8 < lower_bound_1) {
      local_c8 = lower_bound_1;
    }
  }
  else {
    upper_bound_1 = lower_bound_1;
  }
  if (3.2040245907439903e-74 <= upper_bound_1) {
    if (local_c8 <= 1.447401115466452e+76) {
      dVar2 = max2 * max3 * max4 * lower_bound_1 * 2.111354066053168e-14;
      if (dVar1 <= dVar2) {
        if (-dVar2 <= dVar1) {
          return 0;
        }
        eps._4_4_ = -1;
      }
      else {
        eps._4_4_ = 1;
      }
      p0_local._4_4_ = eps._4_4_;
    }
    else {
      p0_local._4_4_ = 0;
    }
  }
  else {
    p0_local._4_4_ = 0;
  }
  return p0_local._4_4_;
}

Assistant:

inline int det_4d_filter( const double* p0, const double* p1, const double* p2, const double* p3) {
    double m12;
    m12 = ((p1[0] * p0[1]) - (p0[0] * p1[1]));
    double m13;
    m13 = ((p2[0] * p0[1]) - (p0[0] * p2[1]));
    double m14;
    m14 = ((p3[0] * p0[1]) - (p0[0] * p3[1]));
    double m23;
    m23 = ((p2[0] * p1[1]) - (p1[0] * p2[1]));
    double m24;
    m24 = ((p3[0] * p1[1]) - (p1[0] * p3[1]));
    double m34;
    m34 = ((p3[0] * p2[1]) - (p2[0] * p3[1]));
    double m123;
    m123 = (((m23 * p0[2]) - (m13 * p1[2])) + (m12 * p2[2]));
    double m124;
    m124 = (((m24 * p0[2]) - (m14 * p1[2])) + (m12 * p3[2]));
    double m134;
    m134 = (((m34 * p0[2]) - (m14 * p2[2])) + (m13 * p3[2]));
    double m234;
    m234 = (((m34 * p1[2]) - (m24 * p2[2])) + (m23 * p3[2]));
    double Delta;
    Delta = ((((m234 * p0[3]) - (m134 * p1[3])) + (m124 * p2[3])) - (m123 * p3[3]));
    int int_tmp_result;
    double eps;
    double max1 = fabs(p0[0]);
    if( (max1 < fabs(p1[0])) )
    {
        max1 = fabs(p1[0]);
    } 
    if( (max1 < fabs(p2[0])) )
    {
        max1 = fabs(p2[0]);
    } 
    if( (max1 < fabs(p3[0])) )
    {
        max1 = fabs(p3[0]);
    } 
    double max2 = fabs(p0[1]);
    if( (max2 < fabs(p1[1])) )
    {
        max2 = fabs(p1[1]);
    } 
    if( (max2 < fabs(p2[1])) )
    {
        max2 = fabs(p2[1]);
    } 
    if( (max2 < fabs(p3[1])) )
    {
        max2 = fabs(p3[1]);
    } 
    double max3 = fabs(p0[2]);
    if( (max3 < fabs(p1[2])) )
    {
        max3 = fabs(p1[2]);
    } 
    if( (max3 < fabs(p2[2])) )
    {
        max3 = fabs(p2[2]);
    } 
    if( (max3 < fabs(p3[2])) )
    {
        max3 = fabs(p3[2]);
    } 
    double max4 = fabs(p0[3]);
    if( (max4 < fabs(p1[3])) )
    {
        max4 = fabs(p1[3]);
    } 
    if( (max4 < fabs(p2[3])) )
    {
        max4 = fabs(p2[3]);
    } 
    if( (max4 < fabs(p3[3])) )
    {
        max4 = fabs(p3[3]);
    } 
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (lower_bound_1 < 3.20402459074399025456e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.44740111546645196071e+76) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (2.11135406605316806158e-14 * (((max1 * max2) * max3) * max4));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return int_tmp_result;
}